

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O0

int cmsys::regtry(char *string,char **start,char **end,char *prog)

{
  int iVar1;
  char **local_48;
  char **ep;
  char **sp1;
  int i;
  char *prog_local;
  char **end_local;
  char **start_local;
  char *string_local;
  
  reginput = string;
  regstartp = start;
  regendp = end;
  local_48 = end;
  ep = start;
  for (sp1._4_4_ = 10; 0 < sp1._4_4_; sp1._4_4_ = sp1._4_4_ + -1) {
    *ep = (char *)0x0;
    *local_48 = (char *)0x0;
    local_48 = local_48 + 1;
    ep = ep + 1;
  }
  iVar1 = regmatch(prog + 1);
  if (iVar1 != 0) {
    *start = string;
    *end = reginput;
  }
  string_local._4_4_ = (uint)(iVar1 != 0);
  return string_local._4_4_;
}

Assistant:

static int regtry(const char* string, const char** start, const char** end,
                  const char* prog)
{
  int i;
  const char** sp1;
  const char** ep;

  reginput = string;
  regstartp = start;
  regendp = end;

  sp1 = start;
  ep = end;
  for (i = RegularExpression::NSUBEXP; i > 0; i--) {
    *sp1++ = 0;
    *ep++ = 0;
  }
  if (regmatch(prog + 1)) {
    start[0] = string;
    end[0] = reginput;
    return (1);
  } else
    return (0);
}